

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Tbc::Text::spliceLine(Text *this,size_t _indent,string *_remainder,size_t _pos)

{
  size_type *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)_indent);
  std::__cxx11::string::substr((ulong)&local_68,(ulong)_remainder);
  uVar3 = 0xf;
  if (local_48 != local_38) {
    uVar3 = local_38[0];
  }
  if (uVar3 < (ulong)(local_60 + local_40)) {
    uVar3 = 0xf;
    if (local_68 != local_58) {
      uVar3 = local_58[0];
    }
    if ((ulong)(local_60 + local_40) <= uVar3) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_001315cf;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_001315cf:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  psVar1 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_88.field_2._M_allocated_capacity = *psVar1;
    local_88.field_2._8_8_ = puVar2[3];
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar1;
    local_88._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_88._M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines,
             &local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__cxx11::string::substr((ulong)&local_88,(ulong)_remainder);
  std::__cxx11::string::operator=((string *)_remainder,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void spliceLine( std::size_t _indent, std::string& _remainder, std::size_t _pos ) {
            lines.push_back( std::string( _indent, ' ' ) + _remainder.substr( 0, _pos ) );
            _remainder = _remainder.substr( _pos );
        }